

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

void __thiscall
Jupiter::IRC::Client::partChannel(Client *this,string_view in_channel,string_view in_message)

{
  bool bVar1;
  pointer this_00;
  size_type sVar2;
  const_pointer __n;
  size_type sVar3;
  const_pointer pvVar4;
  pointer ppVar5;
  int __flags;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
  local_80;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
  local_78;
  iterator channel;
  string local_60;
  __sv_type local_40;
  Client *local_30;
  Client *this_local;
  string_view in_message_local;
  string_view in_channel_local;
  
  in_message_local._M_len = (size_t)in_message._M_str;
  this_local = (Client *)in_message._M_len;
  in_message_local._M_str = (char *)in_channel._M_len;
  local_30 = this;
  this_00 = std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::operator->
                      (&this->m_socket);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&in_message_local._M_str);
  __n = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&in_message_local._M_str);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  string_printf_abi_cxx11_(&local_60,"PART %.*s :%.*s\r\n",sVar2,__n,sVar3,pvVar4);
  __flags = (int)sVar3;
  local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  Socket::send(this_00,(int)local_40._M_len,local_40._M_str,(size_t)__n,__flags);
  std::__cxx11::string::~string((string *)&local_60);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::string,Jupiter::IRC::Client::Channel,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::IRC::Client::Channel>>>
       ::find<std::basic_string_view<char,std::char_traits<char>>>
                 ((unordered_map<std::__cxx11::string,Jupiter::IRC::Client::Channel,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::IRC::Client::Channel>>>
                   *)&this->m_channels,
                  (basic_string_view<char,_std::char_traits<char>_> *)&in_message_local._M_str);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
       ::end(&this->m_channels);
  bVar1 = std::__detail::operator==(&local_78,&local_80);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
                           *)&local_78);
    Channel::setType(&ppVar5->second,-2);
  }
  return;
}

Assistant:

void Jupiter::IRC::Client::partChannel(std::string_view in_channel, std::string_view in_message) {
	m_socket->send(string_printf("PART %.*s :%.*s" ENDL, in_channel.size(), in_channel.data(), in_message.size(), in_message.data()));

	auto channel = m_channels.find(JUPITER_WRAP_MAP_KEY(in_channel));
	if (channel != m_channels.end()) {
		channel->second.setType(-2);
	}
}